

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCom.cpp
# Opt level: O0

void server::allowmaster_cmd(int cid,char **args,int argc)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  clientinfo *ci;
  int togglenum;
  bool usage;
  int argc_local;
  char **args_local;
  int cid_local;
  
  bVar1 = false;
  bVar2 = QServ::getlastSA(&qs);
  if (bVar2) {
    iVar4 = atoi(args[1]);
    if ((iVar4 == 1) && (mastermask == 3)) {
      switchallowmaster();
      iVar4 = QServ::getSender(&qs);
      QServ::getClient(&qs,iVar4);
      out(3,"\f7Claiming \f0master \f7with \"/setmaster 1\" is now \f0enabled");
    }
    else if ((iVar4 == 0) && (mastermask == 0x100f)) {
      switchdisallowmaster();
      out(3,"\f7Claiming \f0master \f7with \"/setmaster 1\" is now \f3disabled");
    }
    else if ((iVar4 == 0) && (mastermask == 3)) {
      iVar4 = QServ::getSender(&qs);
      sendf(iVar4,1,"ris",0x23,
            "\f3Error: Master is already disabled. Use \f2#allowmaster 1 \f3to enable it.");
    }
    else if ((iVar4 == 1) && (mastermask == 0x100f)) {
      iVar4 = QServ::getSender(&qs);
      sendf(iVar4,1,"ris",0x23,
            "\f3Error: Master is already enabled. Use \f2#allowmaster 0 \f3to disable it.");
    }
    else if ((((iVar4 == 0) || (iVar3 = isalpha(iVar4), iVar3 != 0)) || (iVar4 < 0)) || (1 < iVar4))
    {
      bVar1 = true;
    }
  }
  else {
    bVar1 = true;
  }
  if (bVar1) {
    iVar4 = QServ::getSender(&qs);
    pcVar5 = QServ::getCommandDesc(&qs,cid);
    sendf(iVar4,1,"ris",0x23,pcVar5);
  }
  return;
}

Assistant:

QSERV_CALLBACK allowmaster_cmd(p) {
        bool usage = false;
        int togglenum = -1;
        if(CMD_SA) {
            togglenum = atoi(args[1]);
                if(togglenum==1 && mastermask == MM_PUBSERV) {
                    switchallowmaster();
                    clientinfo *ci = qs.getClient(CMD_SENDER);
                    out(ECHO_SERV, "\f7Claiming \f0master \f7with \"/setmaster 1\" is now \f0enabled");
                }
                else if(togglenum==0 && mastermask == MM_PRIVSERV) {
                    switchdisallowmaster();
                    out(ECHO_SERV, "\f7Claiming \f0master \f7with \"/setmaster 1\" is now \f3disabled");
                }
                else if(togglenum==0 && mastermask == MM_PUBSERV) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Master is already disabled. Use \f2#allowmaster 1 \f3to enable it.");
                else if(togglenum==1 && mastermask == MM_PRIVSERV) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, "\f3Error: Master is already enabled. Use \f2#allowmaster 0 \f3to disable it.");
                else if(togglenum==NULL || isalpha(togglenum) || togglenum < 0 || togglenum > 1) usage = true;
        } else {
            togglenum = -1;
            usage = true;
        }
        if(usage) sendf(CMD_SENDER, 1, "ris", N_SERVMSG, CMD_DESC(cid));
    }